

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iSWAP.cpp
# Opt level: O0

void test_qclab_qgates_iSWAP<std::complex<float>>(void)

{
  allocator<std::complex<float>_> *paVar1;
  initializer_list<std::complex<float>_> __l;
  initializer_list<std::complex<float>_> __l_00;
  initializer_list<std::complex<float>_> __l_01;
  initializer_list<std::complex<float>_> __l_02;
  initializer_list<std::complex<float>_> __l_03;
  initializer_list<std::complex<float>_> __l_04;
  initializer_list<std::complex<float>_> __l_05;
  initializer_list<std::complex<float>_> __l_06;
  initializer_list<std::complex<float>_> __l_07;
  initializer_list<std::complex<float>_> __l_08;
  initializer_list<std::complex<float>_> __l_09;
  initializer_list<std::complex<float>_> __l_10;
  initializer_list<std::complex<float>_> __l_11;
  initializer_list<std::complex<float>_> __l_12;
  initializer_list<std::complex<float>_> __l_13;
  initializer_list<std::complex<float>_> __l_14;
  initializer_list<std::complex<float>_> __l_15;
  bool bVar2;
  char *pcVar3;
  reference pvVar4;
  complex<float> cVar5;
  complex<float> *pcVar6;
  complex<float> m01;
  complex<float> m01_00;
  complex<float> cVar7;
  complex<float> in_R9;
  complex<float> m10;
  complex<float> in_stack_ffffffffffffea18;
  complex<float> in_stack_ffffffffffffea20;
  complex<float> in_stack_ffffffffffffea28;
  SquareMatrix<std::complex<float>_> local_1458;
  SquareMatrix<std::complex<float>_> local_1448;
  undefined1 local_1438 [8];
  SquareMatrix<std::complex<float>_> mat3_1;
  SquareMatrix<std::complex<float>_> check;
  complex<float> i_1;
  iSWAP<std::complex<float>_> iswap_6;
  SquareMatrix<std::complex<float>_> local_13f0;
  SquareMatrix<std::complex<float>_> local_13e0;
  SquareMatrix<std::complex<float>_> local_13d0;
  SquareMatrix<std::complex<float>_> local_13c0;
  SquareMatrix<std::complex<float>_> local_13b0;
  SquareMatrix<std::complex<float>_> local_13a0;
  SquareMatrix<std::complex<float>_> local_1390;
  SquareMatrix<std::complex<float>_> local_1380;
  SquareMatrix<std::complex<float>_> local_1370;
  int local_1360 [2];
  int qnew_2 [2];
  SquareMatrix<std::complex<float>_> local_1348;
  SquareMatrix<std::complex<float>_> local_1338;
  SquareMatrix<std::complex<float>_> local_1328;
  SquareMatrix<std::complex<float>_> local_1318;
  SquareMatrix<std::complex<float>_> local_1308;
  SquareMatrix<std::complex<float>_> local_12f8;
  SquareMatrix<std::complex<float>_> local_12e8;
  SquareMatrix<std::complex<float>_> local_12d8;
  SquareMatrix<std::complex<float>_> local_12c8;
  undefined1 local_12b8 [8];
  SquareMatrix<std::complex<float>_> mat3;
  SquareMatrix<std::complex<float>_> local_1298;
  SquareMatrix<std::complex<float>_> local_1288;
  SquareMatrix<std::complex<float>_> local_1278;
  SquareMatrix<std::complex<float>_> local_1268;
  SquareMatrix<std::complex<float>_> local_1258;
  SquareMatrix<std::complex<float>_> local_1248;
  undefined1 local_1238 [8];
  SquareMatrix<std::complex<float>_> iswapH;
  SquareMatrix<std::complex<float>_> local_1218;
  SquareMatrix<std::complex<float>_> local_1208;
  SquareMatrix<std::complex<float>_> local_11f8;
  SquareMatrix<std::complex<float>_> local_11e8;
  SquareMatrix<std::complex<float>_> local_11d8;
  SquareMatrix<std::complex<float>_> local_11c8;
  complex<float> local_11b8;
  complex<float> local_11b0;
  complex<float> local_11a8;
  complex<float> local_11a0;
  complex<float> local_1198;
  complex<float> local_1190;
  complex<float> local_1188;
  complex<float> local_1180;
  complex<float> local_1178;
  complex<float> local_1170;
  complex<float> local_1168;
  complex<float> local_1160;
  complex<float> local_1158;
  complex<float> local_1150;
  complex<float> local_1148;
  complex<float> local_1140;
  undefined1 local_1138 [8];
  SquareMatrix<std::complex<float>_> mat;
  SquareMatrix<std::complex<float>_> local_1118;
  undefined1 local_1108 [8];
  SquareMatrix<std::complex<float>_> mat2;
  iSWAP<std::complex<float>_> iswap_5;
  allocator<std::complex<float>_> local_1089;
  complex<float> local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  iterator local_1048;
  size_type local_1040;
  undefined1 local_1038 [8];
  V check3_1;
  V vec3_1;
  iSWAP<std::complex<float>_> iswap_4;
  complex<float> local_f68;
  undefined8 uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  iterator local_ee8;
  undefined8 local_ee0;
  complex<float> local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  iterator local_e58;
  undefined8 local_e50;
  complex<float> local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  iterator local_dc8;
  undefined8 local_dc0;
  complex<float> local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  iterator local_d30;
  undefined8 local_d28;
  allocator<std::complex<float>_> local_d19;
  complex<float> local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  iterator local_c98;
  size_type local_c90;
  undefined1 local_c88 [8];
  V check4;
  V vec4;
  complex<float> local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  iterator local_bc0;
  undefined8 local_bb8;
  int local_bb0 [2];
  int qnew_1 [2];
  allocator<std::complex<float>_> local_b49;
  complex<float> local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  iterator local_b08;
  size_type local_b00;
  undefined1 local_af8 [8];
  V check3;
  V vec3;
  allocator<std::complex<float>_> local_a89;
  complex<float> local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  iterator local_a68;
  size_type local_a60;
  undefined1 local_a58 [8];
  V check2;
  V vec2;
  iSWAP<std::complex<float>_> iswap_3;
  Message local_a10;
  int local_a04;
  vector<int,_std::allocator<int>_> local_a00;
  undefined1 local_9e8 [8];
  AssertionResult gtest_ar_14;
  Message local_9d0;
  int local_9c4;
  vector<int,_std::allocator<int>_> local_9c0;
  undefined1 local_9a8 [8];
  AssertionResult gtest_ar_13;
  AssertHelper local_978;
  Message local_970;
  bool local_961;
  undefined1 local_960 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_930;
  Message local_928;
  bool local_919;
  undefined1 local_918 [8];
  AssertionResult gtest_ar__7;
  Message local_900;
  int local_8f8;
  int local_8f4;
  undefined1 local_8f0 [8];
  AssertionResult gtest_ar_12;
  iSWAP<std::complex<float>_> iswap_2;
  int qubits_1 [2];
  Message local_8c0;
  int local_8b4;
  vector<int,_std::allocator<int>_> local_8b0;
  undefined1 local_898 [8];
  AssertionResult gtest_ar_11;
  Message local_880;
  int local_874;
  vector<int,_std::allocator<int>_> local_870;
  undefined1 local_858 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_828;
  Message local_820;
  bool local_811;
  undefined1 local_810 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_7e0;
  Message local_7d8;
  bool local_7c9;
  undefined1 local_7c8 [8];
  AssertionResult gtest_ar__5;
  Message local_7b0;
  int local_7a8;
  int local_7a4;
  undefined1 local_7a0 [8];
  AssertionResult gtest_ar_9;
  iSWAP<std::complex<float>_> iswap_1;
  AssertHelper local_760;
  Message local_758;
  bool local_749;
  undefined1 local_748 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_718;
  Message local_710;
  bool local_701;
  undefined1 local_700 [8];
  AssertionResult gtest_ar__3;
  iSWAP<std::complex<float>_> iswap2;
  AssertHelper local_6c0;
  Message local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  undefined1 local_690 [8];
  AssertionResult gtest_ar_8;
  Message local_678;
  int local_670;
  int local_66c;
  undefined1 local_668 [8];
  AssertionResult gtest_ar_7;
  stringstream qasm;
  ostream local_648 [376];
  string local_4d0;
  AssertHelper local_4b0;
  Message local_4a8;
  SquareMatrix<std::complex<float>_> local_4a0;
  bool local_489;
  undefined1 local_488 [8];
  AssertionResult gtest_ar__2;
  complex<float> local_470;
  complex<float> local_468;
  complex<float> local_460;
  complex<float> local_458;
  complex<float> local_450;
  complex<float> local_448;
  complex<float> local_440;
  complex<float> local_438;
  tuple<std::complex<float>_*,_std::default_delete<std::complex<float>[]>_> local_430;
  complex<float> local_428;
  complex<float> local_420;
  complex<float> local_418;
  complex<float> local_410;
  complex<float> local_408;
  complex<float> local_400;
  undefined1 local_3f8 [8];
  SquareMatrix<std::complex<float>_> iSWAP_check;
  complex<float> i;
  Message local_3d8;
  int local_3cc;
  vector<int,_std::allocator<int>_> local_3c8;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_6;
  Message local_398;
  int local_38c;
  vector<int,_std::allocator<int>_> local_388;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_5;
  int qnew [2];
  Message local_350;
  int local_344;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_4;
  Message local_328;
  int local_31c;
  undefined1 local_318 [8];
  AssertionResult gtest_ar_3;
  Message local_300;
  int local_2f4;
  size_type local_2f0;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_2;
  vector<int,_std::allocator<int>_> qubits;
  Message local_2b8;
  int local_2b0;
  int local_2ac;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_278;
  Message local_270;
  bool local_261;
  undefined1 local_260 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_230;
  Message local_228;
  bool local_219;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_;
  Message local_200;
  int local_1f8;
  int local_1f4;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar;
  iSWAP<std::complex<float>_> iswap;
  complex<float> local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  iterator local_148;
  size_type local_140;
  undefined1 local_138 [8];
  V v4;
  complex<float> local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  iterator local_d8;
  size_type local_d0;
  undefined1 local_c8 [8];
  V v3;
  complex<float> local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  iterator local_80;
  size_type local_78;
  undefined1 local_70 [8];
  V v2;
  SquareMatrix<std::complex<float>_> I4;
  SquareMatrix<std::complex<float>_> I3;
  undefined1 local_28 [8];
  SquareMatrix<std::complex<float>_> I2;
  SquareMatrix<std::complex<float>_> I1;
  
  qclab::dense::eye<std::complex<float>>((dense *)&I2.data_,2);
  qclab::dense::eye<std::complex<float>>((dense *)local_28,4);
  qclab::dense::eye<std::complex<float>>((dense *)&I4.data_,8);
  qclab::dense::eye<std::complex<float>>
            ((dense *)&v2.
                       super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,0x10);
  local_98 = 0x40000000;
  uStack_90 = 0x40e00000;
  local_a8._M_value = 0x40400000;
  uStack_a0 = 0x40a00000;
  local_80 = &local_a8;
  local_78 = 4;
  paVar1 = (allocator<std::complex<float>_> *)
           ((long)&v3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::complex<float>_>::allocator(paVar1);
  __l_15._M_len = local_78;
  __l_15._M_array = local_80;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_70,__l_15,
             paVar1);
  std::allocator<std::complex<float>_>::~allocator
            ((allocator<std::complex<float>_> *)
             ((long)&v3.
                     super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_e8 = 0x41000000;
  uStack_e0 = 0x40400000;
  local_f8 = 0x40800000;
  uStack_f0 = 0x3f800000;
  local_108 = 0x40000000;
  uStack_100 = 0x40e00000;
  local_118._M_value = 0x40400000;
  uStack_110 = 0x40a00000;
  local_d8 = &local_118;
  local_d0 = 8;
  paVar1 = (allocator<std::complex<float>_> *)
           ((long)&v4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::complex<float>_>::allocator(paVar1);
  __l_14._M_len = local_d0;
  __l_14._M_array = local_d8;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c8,__l_14,
             paVar1);
  std::allocator<std::complex<float>_>::~allocator
            ((allocator<std::complex<float>_> *)
             ((long)&v4.
                     super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_158 = 0x40a00000;
  uStack_150 = 0x3f800000;
  local_168 = 0x41000000;
  uStack_160 = 0x41100000;
  local_178 = 0x40a00000;
  uStack_170 = 0x40c00000;
  local_188 = 0x40e00000;
  uStack_180 = 0x40000000;
  local_198 = 0x41000000;
  uStack_190 = 0x40400000;
  local_1a8 = 0x40800000;
  uStack_1a0 = 0x3f800000;
  local_1b8 = 0x40000000;
  uStack_1b0 = 0x40e00000;
  local_1c8._M_value = 0x40400000;
  uStack_1c0 = 0x40a00000;
  local_148 = &local_1c8;
  local_140 = 0x10;
  paVar1 = (allocator<std::complex<float>_> *)((long)iswap.qubits_._M_elems + 7);
  std::allocator<std::complex<float>_>::allocator(paVar1);
  __l_13._M_len = local_140;
  __l_13._M_array = local_148;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_138,__l_13,
             paVar1);
  std::allocator<std::complex<float>_>::~allocator
            ((allocator<std::complex<float>_> *)((long)iswap.qubits_._M_elems + 7));
  qclab::qgates::iSWAP<std::complex<float>_>::iSWAP
            ((iSWAP<std::complex<float>_> *)&gtest_ar.message_);
  local_1f4 = qclab::qgates::QGate2<std::complex<float>_>::nbQubits
                        ((QGate2<std::complex<float>_> *)&gtest_ar.message_);
  local_1f8 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1f0,"iswap.nbQubits()","2",&local_1f4,&local_1f8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar2) {
    testing::Message::Message(&local_200);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x3b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  local_219 = qclab::qgates::iSWAP<std::complex<float>_>::fixed
                        ((iSWAP<std::complex<float>_> *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_218,&local_219,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar2) {
    testing::Message::Message(&local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_218,
               (AssertionResult *)"iswap.fixed()","false","true",(char *)in_R9._M_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x3c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_230,&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  bVar2 = qclab::qgates::iSWAP<std::complex<float>_>::controlled
                    ((iSWAP<std::complex<float>_> *)&gtest_ar.message_);
  local_261 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_260,&local_261,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar2) {
    testing::Message::Message(&local_270);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_260,
               (AssertionResult *)"iswap.controlled()","true","false",(char *)in_R9._M_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x3d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_278,&local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  local_2ac = qclab::qgates::iSWAP<std::complex<float>_>::qubit
                        ((iSWAP<std::complex<float>_> *)&gtest_ar.message_);
  local_2b0 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_2a8,"iswap.qubit()","0",&local_2ac,&local_2b0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar2) {
    testing::Message::Message(&local_2b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x40,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  qclab::qgates::iSWAP<std::complex<float>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_,
             (iSWAP<std::complex<float>_> *)&gtest_ar.message_);
  local_2f0 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_);
  local_2f4 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2e8,"qubits.size()","2",&local_2f0,&local_2f4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar2) {
    testing::Message::Message(&local_300);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x44,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_,0);
  local_31c = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_318,"qubits[0]","0",pvVar4,&local_31c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
  if (!bVar2) {
    testing::Message::Message(&local_328);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_318);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x45,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_,1);
  local_344 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_340,"qubits[1]","1",pvVar4,&local_344);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
  if (!bVar2) {
    testing::Message::Message(&local_350);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)qnew,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x46,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)qnew,&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)qnew);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x500000003;
  qclab::qgates::iSWAP<std::complex<float>_>::setQubits
            ((iSWAP<std::complex<float>_> *)&gtest_ar.message_,(int *)&gtest_ar_5.message_);
  qclab::qgates::iSWAP<std::complex<float>_>::qubits
            (&local_388,(iSWAP<std::complex<float>_> *)&gtest_ar.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_388,0);
  local_38c = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_370,"iswap.qubits()[0]","3",pvVar4,&local_38c);
  std::vector<int,_std::allocator<int>_>::~vector(&local_388);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar2) {
    testing::Message::Message(&local_398);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x49,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_398);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  qclab::qgates::iSWAP<std::complex<float>_>::qubits
            (&local_3c8,(iSWAP<std::complex<float>_> *)&gtest_ar.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_3c8,1);
  local_3cc = 5;
  cVar5._M_value = (_ComplexT)&local_3cc;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_3b0,"iswap.qubits()[1]","5",pvVar4,(int *)cVar5._M_value);
  std::vector<int,_std::allocator<int>_>::~vector(&local_3c8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
  if (!bVar2) {
    testing::Message::Message(&local_3d8);
    cVar5._M_value =
         (_ComplexT)testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&i,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x4a,(char *)cVar5._M_value);
    testing::internal::AssertHelper::operator=((AssertHelper *)&i,&local_3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i);
    testing::Message::~Message(&local_3d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x100000000;
  cVar7._M_value = (_ComplexT)&gtest_ar_5.message_;
  qclab::qgates::iSWAP<std::complex<float>_>::setQubits
            ((iSWAP<std::complex<float>_> *)&gtest_ar.message_,(int *)cVar7._M_value);
  std::complex<float>::complex((complex<float> *)&iSWAP_check.data_,0.0,1.0);
  std::complex<float>::complex(&local_400,1.0,0.0);
  std::complex<float>::complex(&local_408,0.0,0.0);
  std::complex<float>::complex(&local_410,0.0,0.0);
  std::complex<float>::complex(&local_418,0.0,0.0);
  std::complex<float>::complex(&local_420,0.0,0.0);
  std::complex<float>::complex(&local_428,0.0,0.0);
  local_430.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>)
       (_Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>)
       iSWAP_check.data_._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  std::complex<float>::complex(&local_438,0.0,0.0);
  std::complex<float>::complex(&local_440,0.0,0.0);
  local_448._M_value =
       (_ComplexT)
       iSWAP_check.data_._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  std::complex<float>::complex(&local_450,0.0,0.0);
  std::complex<float>::complex(&local_458,0.0,0.0);
  std::complex<float>::complex(&local_460,0.0,0.0);
  std::complex<float>::complex(&local_468,0.0,0.0);
  std::complex<float>::complex(&local_470,0.0,0.0);
  std::complex<float>::complex((complex<float> *)&gtest_ar__2.message_,1.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_3f8,cVar7,m01,local_440,cVar5,in_R9,
             local_440,local_448,local_450,local_458,local_460,local_468,local_470,
             (complex<float>)
             gtest_ar__2.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,in_stack_ffffffffffffea18,in_stack_ffffffffffffea20,
             in_stack_ffffffffffffea28);
  qclab::qgates::iSWAP<std::complex<float>_>::matrix((iSWAP<std::complex<float>_> *)&local_4a0);
  local_489 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                        (&local_4a0,(SquareMatrix<std::complex<float>_> *)local_3f8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_488,&local_489,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_4a0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
  if (!bVar2) {
    testing::Message::Message(&local_4a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_4d0,(internal *)local_488,(AssertionResult *)"iswap.matrix() == iSWAP_check",
               "false","true",(char *)in_R9._M_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x55,pcVar3);
    testing::internal::AssertHelper::operator=(&local_4b0,&local_4a8);
    testing::internal::AssertHelper::~AssertHelper(&local_4b0);
    std::__cxx11::string::~string((string *)&local_4d0);
    testing::Message::~Message(&local_4a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
  qclab::qgates::QGate2<std::complex<float>_>::print
            ((QGate2<std::complex<float>_> *)&gtest_ar.message_);
  std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar_7.message_);
  local_66c = qclab::qgates::iSWAP<std::complex<float>_>::toQASM
                        ((iSWAP<std::complex<float>_> *)&gtest_ar.message_,local_648,0);
  local_670 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_668,"iswap.toQASM( qasm )","0",&local_66c,&local_670);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_668);
  if (!bVar2) {
    testing::Message::Message(&local_678);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_668);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x5c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_678);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_668);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[19],_nullptr>
            ((EqHelper *)local_690,"qasm.str()","\"iswap q[0], q[1];\\n\"",&local_6b0,
             (char (*) [19])"iswap q[0], q[1];\n");
  std::__cxx11::string::~string((string *)&local_6b0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_690);
  if (!bVar2) {
    testing::Message::Message(&local_6b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_690);
    testing::internal::AssertHelper::AssertHelper
              (&local_6c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x5d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6c0,&local_6b8);
    testing::internal::AssertHelper::~AssertHelper(&local_6c0);
    testing::Message::~Message(&local_6b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_690);
  std::__cxx11::stringstream::str();
  std::operator<<((ostream *)&std::cout,(string *)&iswap2.qubits_);
  std::__cxx11::string::~string((string *)&iswap2.qubits_);
  qclab::qgates::iSWAP<std::complex<float>_>::iSWAP
            ((iSWAP<std::complex<float>_> *)&gtest_ar__3.message_,2,4);
  local_701 = qclab::QObject<std::complex<float>_>::operator==
                        ((QObject<std::complex<float>_> *)&gtest_ar.message_,
                         (QObject<std::complex<float>_> *)&gtest_ar__3.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_700,&local_701,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_700);
  if (!bVar2) {
    testing::Message::Message(&local_710);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_700,
               (AssertionResult *)"iswap == iswap2","false","true",(char *)in_R9._M_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_718,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x62,pcVar3);
    testing::internal::AssertHelper::operator=(&local_718,&local_710);
    testing::internal::AssertHelper::~AssertHelper(&local_718);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_710);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_700);
  bVar2 = qclab::QObject<std::complex<float>_>::operator!=
                    ((QObject<std::complex<float>_> *)&gtest_ar.message_,
                     (QObject<std::complex<float>_> *)&gtest_ar__3.message_);
  local_749 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_748,&local_749,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_748);
  if (!bVar2) {
    testing::Message::Message(&local_758);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&iswap_1.qubits_,(internal *)local_748,(AssertionResult *)"iswap != iswap2"
               ,"true","false",(char *)in_R9._M_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_760,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,99,pcVar3);
    testing::internal::AssertHelper::operator=(&local_760,&local_758);
    testing::internal::AssertHelper::~AssertHelper(&local_760);
    std::__cxx11::string::~string((string *)&iswap_1.qubits_);
    testing::Message::~Message(&local_758);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_748);
  qclab::qgates::iSWAP<std::complex<float>_>::~iSWAP
            ((iSWAP<std::complex<float>_> *)&gtest_ar__3.message_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar_7.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_3f8);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_);
  qclab::qgates::iSWAP<std::complex<float>_>::~iSWAP
            ((iSWAP<std::complex<float>_> *)&gtest_ar.message_);
  qclab::qgates::iSWAP<std::complex<float>_>::iSWAP
            ((iSWAP<std::complex<float>_> *)&gtest_ar_9.message_,3,5);
  local_7a4 = qclab::qgates::QGate2<std::complex<float>_>::nbQubits
                        ((QGate2<std::complex<float>_> *)&gtest_ar_9.message_);
  local_7a8 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_7a0,"iswap.nbQubits()","2",&local_7a4,&local_7a8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7a0);
  if (!bVar2) {
    testing::Message::Message(&local_7b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_7a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x69,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5.message_,&local_7b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_7b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7a0);
  local_7c9 = qclab::qgates::iSWAP<std::complex<float>_>::fixed
                        ((iSWAP<std::complex<float>_> *)&gtest_ar_9.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7c8,&local_7c9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c8);
  if (!bVar2) {
    testing::Message::Message(&local_7d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_7c8,
               (AssertionResult *)"iswap.fixed()","false","true",(char *)in_R9._M_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x6a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7e0,&local_7d8);
    testing::internal::AssertHelper::~AssertHelper(&local_7e0);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_7d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c8);
  bVar2 = qclab::qgates::iSWAP<std::complex<float>_>::controlled
                    ((iSWAP<std::complex<float>_> *)&gtest_ar_9.message_);
  local_811 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_810,&local_811,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_810);
  if (!bVar2) {
    testing::Message::Message(&local_820);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_10.message_,(internal *)local_810,
               (AssertionResult *)"iswap.controlled()","true","false",(char *)in_R9._M_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_828,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x6b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_828,&local_820);
    testing::internal::AssertHelper::~AssertHelper(&local_828);
    std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_820);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_810);
  qclab::qgates::iSWAP<std::complex<float>_>::qubits
            (&local_870,(iSWAP<std::complex<float>_> *)&gtest_ar_9.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_870,0);
  local_874 = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_858,"iswap.qubits()[0]","3",pvVar4,&local_874);
  std::vector<int,_std::allocator<int>_>::~vector(&local_870);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_858);
  if (!bVar2) {
    testing::Message::Message(&local_880);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_858);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x6c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_880);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_880);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_858);
  qclab::qgates::iSWAP<std::complex<float>_>::qubits
            (&local_8b0,(iSWAP<std::complex<float>_> *)&gtest_ar_9.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_8b0,1);
  local_8b4 = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_898,"iswap.qubits()[1]","5",pvVar4,&local_8b4);
  std::vector<int,_std::allocator<int>_>::~vector(&local_8b0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_898);
  if (!bVar2) {
    testing::Message::Message(&local_8c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_898);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)qubits_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x6d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)qubits_1,&local_8c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)qubits_1);
    testing::Message::~Message(&local_8c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_898);
  qclab::qgates::iSWAP<std::complex<float>_>::~iSWAP
            ((iSWAP<std::complex<float>_> *)&gtest_ar_9.message_);
  iswap_2.qubits_._M_elems[0] = 3;
  iswap_2.qubits_._M_elems[1] = 5;
  qclab::qgates::iSWAP<std::complex<float>_>::iSWAP
            ((iSWAP<std::complex<float>_> *)&gtest_ar_12.message_,iswap_2.qubits_._M_elems);
  local_8f4 = qclab::qgates::QGate2<std::complex<float>_>::nbQubits
                        ((QGate2<std::complex<float>_> *)&gtest_ar_12.message_);
  local_8f8 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_8f0,"iswap.nbQubits()","2",&local_8f4,&local_8f8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8f0);
  if (!bVar2) {
    testing::Message::Message(&local_900);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_8f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x74,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__7.message_,&local_900);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_900);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8f0);
  local_919 = qclab::qgates::iSWAP<std::complex<float>_>::fixed
                        ((iSWAP<std::complex<float>_> *)&gtest_ar_12.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_918,&local_919,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_918);
  if (!bVar2) {
    testing::Message::Message(&local_928);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_918,
               (AssertionResult *)"iswap.fixed()","false","true",(char *)in_R9._M_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_930,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x75,pcVar3);
    testing::internal::AssertHelper::operator=(&local_930,&local_928);
    testing::internal::AssertHelper::~AssertHelper(&local_930);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_928);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_918);
  bVar2 = qclab::qgates::iSWAP<std::complex<float>_>::controlled
                    ((iSWAP<std::complex<float>_> *)&gtest_ar_12.message_);
  local_961 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_960,&local_961,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_960);
  if (!bVar2) {
    testing::Message::Message(&local_970);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_13.message_,(internal *)local_960,
               (AssertionResult *)"iswap.controlled()","true","false",(char *)in_R9._M_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_978,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x76,pcVar3);
    testing::internal::AssertHelper::operator=(&local_978,&local_970);
    testing::internal::AssertHelper::~AssertHelper(&local_978);
    std::__cxx11::string::~string((string *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_970);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_960);
  qclab::qgates::iSWAP<std::complex<float>_>::qubits
            (&local_9c0,(iSWAP<std::complex<float>_> *)&gtest_ar_12.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_9c0,0);
  local_9c4 = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_9a8,"iswap.qubits()[0]","3",pvVar4,&local_9c4);
  std::vector<int,_std::allocator<int>_>::~vector(&local_9c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9a8);
  if (!bVar2) {
    testing::Message::Message(&local_9d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_9a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x77,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_9d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_9d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9a8);
  qclab::qgates::iSWAP<std::complex<float>_>::qubits
            (&local_a00,(iSWAP<std::complex<float>_> *)&gtest_ar_12.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_a00,1);
  local_a04 = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_9e8,"iswap.qubits()[1]","5",pvVar4,&local_a04);
  std::vector<int,_std::allocator<int>_>::~vector(&local_a00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9e8);
  if (!bVar2) {
    testing::Message::Message(&local_a10);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_9e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iswap_3.qubits_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x78,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iswap_3.qubits_,&local_a10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iswap_3.qubits_);
    testing::Message::~Message(&local_a10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9e8);
  qclab::qgates::iSWAP<std::complex<float>_>::~iSWAP
            ((iSWAP<std::complex<float>_> *)&gtest_ar_12.message_);
  qclab::qgates::iSWAP<std::complex<float>_>::iSWAP
            ((iSWAP<std::complex<float>_> *)
             &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0,1);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_70);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)
             &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,2,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_a78 = 0x40a0000000000000;
  uStack_a70 = 0x40e00000;
  local_a88._M_value = 0x40400000;
  uStack_a80 = 0x4000000000000000;
  local_a68 = &local_a88;
  local_a60 = 4;
  std::allocator<std::complex<float>_>::allocator(&local_a89);
  __l_12._M_len = local_a60;
  __l_12._M_array = local_a68;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_a58,__l_12,
             &local_a89);
  std::allocator<std::complex<float>_>::~allocator(&local_a89);
  test_qclab_qgates_iSWAP_check<std::complex<float>>
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_a58);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_70);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)
             &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,ConjTrans,2,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  vec3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x40400000;
  __l_11._M_len = 4;
  __l_11._M_array =
       (iterator)
       &vec3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_a58,__l_11)
  ;
  test_qclab_qgates_iSWAP_check<std::complex<float>>
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_a58);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c8);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)
             &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,3,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_b18 = 0x41000000;
  uStack_b10 = 0x40400000;
  local_b28 = 0x4000000000000000;
  uStack_b20 = 0x40e0000000000000;
  local_b38 = 0x4080000000000000;
  uStack_b30 = 0x3f80000000000000;
  local_b48._M_value = 0x40400000;
  uStack_b40 = 0x40a00000;
  local_b08 = &local_b48;
  local_b00 = 8;
  std::allocator<std::complex<float>_>::allocator(&local_b49);
  __l_10._M_len = local_b00;
  __l_10._M_array = local_b08;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_af8,__l_10,
             &local_b49);
  std::allocator<std::complex<float>_>::~allocator(&local_b49);
  test_qclab_qgates_iSWAP_check<std::complex<float>>
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_af8);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c8);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)
             &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,ConjTrans,3,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  qnew_1[0] = 0x40400000;
  qnew_1[1] = 0;
  __l_09._M_len = 8;
  __l_09._M_array = (iterator)qnew_1;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_af8,__l_09)
  ;
  test_qclab_qgates_iSWAP_check<std::complex<float>>
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_af8);
  local_bb0[0] = 1;
  local_bb0[1] = 2;
  qclab::qgates::iSWAP<std::complex<float>_>::setQubits
            ((iSWAP<std::complex<float>_> *)
             &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_bb0);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c8);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)
             &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,3,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_bd8 = 0x3f80000000000000;
  uStack_bd0 = 0x40400000;
  local_be8 = 0x40800000;
  uStack_be0 = 0x4100000000000000;
  local_bf8 = 0x40a0000000000000;
  uStack_bf0 = 0x40e00000;
  local_c08._M_value = 0x40400000;
  uStack_c00 = 0x4000000000000000;
  local_bc0 = &local_c08;
  local_bb8 = 8;
  __l_08._M_len = 8;
  __l_08._M_array = local_bc0;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_af8,__l_08)
  ;
  test_qclab_qgates_iSWAP_check<std::complex<float>>
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_af8);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c8);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)
             &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,ConjTrans,3,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  vec4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x40400000;
  __l_07._M_len = 8;
  __l_07._M_array =
       (iterator)
       &vec4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_af8,__l_07)
  ;
  test_qclab_qgates_iSWAP_check<std::complex<float>>
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_af8);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_138);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)
             &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,4,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_ca8 = 0x40a00000;
  uStack_ca0 = 0x3f800000;
  local_cb8 = 0x40a0000000000000;
  uStack_cb0 = 0x40c0000000000000;
  local_cc8 = 0x4100000000000000;
  uStack_cc0 = 0x4110000000000000;
  local_cd8 = 0x40e00000;
  uStack_cd0 = 0x40000000;
  local_ce8 = 0x41000000;
  uStack_ce0 = 0x40400000;
  local_cf8 = 0x4000000000000000;
  uStack_cf0 = 0x40e0000000000000;
  local_d08 = 0x4080000000000000;
  uStack_d00 = 0x3f80000000000000;
  local_d18._M_value = 0x40400000;
  uStack_d10 = 0x40a00000;
  local_c98 = &local_d18;
  local_c90 = 0x10;
  std::allocator<std::complex<float>_>::allocator(&local_d19);
  __l_06._M_len = local_c90;
  __l_06._M_array = local_c98;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c88,__l_06,
             &local_d19);
  std::allocator<std::complex<float>_>::~allocator(&local_d19);
  test_qclab_qgates_iSWAP_check<std::complex<float>>
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c88);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_138);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)
             &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,ConjTrans,4,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_d48 = 0x40a00000;
  uStack_d40 = 0x3f800000;
  local_d58 = 0xc0a0000000000000;
  uStack_d50 = 0xc0c0000000000000;
  local_d68 = 0xc100000000000000;
  uStack_d60 = 0xc110000000000000;
  local_d78 = 0x40e00000;
  uStack_d70 = 0x40000000;
  local_d88 = 0x41000000;
  uStack_d80 = 0x40400000;
  local_d98 = 0xc000000000000000;
  uStack_d90 = 0xc0e0000000000000;
  local_da8 = 0xc080000000000000;
  uStack_da0 = 0xbf80000000000000;
  local_db8._M_value = 0x40400000;
  uStack_db0 = 0x40a00000;
  local_d30 = &local_db8;
  local_d28 = 0x10;
  __l_05._M_len = 0x10;
  __l_05._M_array = local_d30;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c88,__l_05)
  ;
  test_qclab_qgates_iSWAP_check<std::complex<float>>
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c88);
  local_bb0[0] = 0;
  local_bb0[1] = 1;
  qclab::qgates::iSWAP<std::complex<float>_>::setQubits
            ((iSWAP<std::complex<float>_> *)
             &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_bb0);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_138);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)
             &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,4,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_dd8 = 0x40a00000;
  uStack_dd0 = 0x3f800000;
  local_de8 = 0x41000000;
  uStack_de0 = 0x41100000;
  local_df8 = 0x4100000000000000;
  uStack_df0 = 0x4040000000000000;
  local_e08 = 0x4080000000000000;
  uStack_e00 = 0x3f80000000000000;
  local_e18 = 0x40a0000000000000;
  uStack_e10 = 0x40c0000000000000;
  local_e28 = 0x40e0000000000000;
  uStack_e20 = 0x4000000000000000;
  local_e38 = 0x40000000;
  uStack_e30 = 0x40e00000;
  local_e48._M_value = 0x40400000;
  uStack_e40 = 0x40a00000;
  local_dc8 = &local_e48;
  local_dc0 = 0x10;
  __l_04._M_len = 0x10;
  __l_04._M_array = local_dc8;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c88,__l_04)
  ;
  test_qclab_qgates_iSWAP_check<std::complex<float>>
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c88);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_138);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)
             &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,ConjTrans,4,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_e68 = 0x40a00000;
  uStack_e60 = 0x3f800000;
  local_e78 = 0x41000000;
  uStack_e70 = 0x41100000;
  local_e88 = 0xc100000000000000;
  uStack_e80 = 0xc040000000000000;
  local_e98 = 0xc080000000000000;
  uStack_e90 = 0xbf80000000000000;
  local_ea8 = 0xc0a0000000000000;
  uStack_ea0 = 0xc0c0000000000000;
  local_eb8 = 0xc0e0000000000000;
  uStack_eb0 = 0xc000000000000000;
  local_ec8 = 0x40000000;
  uStack_ec0 = 0x40e00000;
  local_ed8._M_value = 0x40400000;
  uStack_ed0 = 0x40a00000;
  local_e58 = &local_ed8;
  local_e50 = 0x10;
  __l_03._M_len = 0x10;
  __l_03._M_array = local_e58;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c88,__l_03)
  ;
  test_qclab_qgates_iSWAP_check<std::complex<float>>
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c88);
  local_bb0[0] = 2;
  local_bb0[1] = 3;
  qclab::qgates::iSWAP<std::complex<float>_>::setQubits
            ((iSWAP<std::complex<float>_> *)
             &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_bb0);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_138);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)
             &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,4,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_ef8 = 0x4110000000000000;
  uStack_ef0 = 0x3f800000;
  local_f08 = 0x41000000;
  uStack_f00 = 0x40a0000000000000;
  local_f18 = 0x4000000000000000;
  uStack_f10 = 0x40c00000;
  local_f28 = 0x40e00000;
  uStack_f20 = 0x40a0000000000000;
  local_f38 = 0x3f80000000000000;
  uStack_f30 = 0x40400000;
  local_f48 = 0x40800000;
  uStack_f40 = 0x4100000000000000;
  local_f58 = 0x40a0000000000000;
  uStack_f50 = 0x40e00000;
  local_f68._M_value = 0x40400000;
  uStack_f60 = 0x4000000000000000;
  local_ee8 = &local_f68;
  local_ee0 = 0x10;
  __l_02._M_len = 0x10;
  __l_02._M_array = local_ee8;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c88,__l_02)
  ;
  test_qclab_qgates_iSWAP_check<std::complex<float>>
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c88);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_138);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)
             &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,ConjTrans,4,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  iswap_4.qubits_._M_elems[0] = 0x40400000;
  iswap_4.qubits_._M_elems[1] = 0;
  __l_01._M_len = 0x10;
  __l_01._M_array = (iterator)&iswap_4.qubits_;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c88,__l_01)
  ;
  test_qclab_qgates_iSWAP_check<std::complex<float>>
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c88);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c88);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_af8);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_a58);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::iSWAP<std::complex<float>_>::~iSWAP
            ((iSWAP<std::complex<float>_> *)
             &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::iSWAP<std::complex<float>_>::iSWAP
            ((iSWAP<std::complex<float>_> *)
             &vec3_1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0,2);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c8);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)
             &vec3_1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,3,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,0);
  local_1058 = 0x40e0000000000000;
  uStack_1050 = 0x40400000;
  local_1068 = 0x40a0000000000000;
  uStack_1060 = 0x3f800000;
  local_1078 = 0x40000000;
  uStack_1070 = 0x4100000000000000;
  local_1088._M_value = 0x40400000;
  uStack_1080 = 0x4080000000000000;
  local_1048 = &local_1088;
  local_1040 = 8;
  std::allocator<std::complex<float>_>::allocator(&local_1089);
  __l_00._M_len = local_1040;
  __l_00._M_array = local_1048;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_1038,__l_00
             ,&local_1089);
  std::allocator<std::complex<float>_>::~allocator(&local_1089);
  test_qclab_qgates_iSWAP_check<std::complex<float>>
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_1038);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c8);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)
             &vec3_1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,ConjTrans,3,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,0);
  iswap_5.qubits_._M_elems[0] = 0x40400000;
  iswap_5.qubits_._M_elems[1] = 0;
  __l._M_len = 8;
  __l._M_array = (iterator)&iswap_5.qubits_;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_1038,__l);
  test_qclab_qgates_iSWAP_check<std::complex<float>>
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_1038);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_1038);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::iSWAP<std::complex<float>_>::~iSWAP
            ((iSWAP<std::complex<float>_> *)
             &vec3_1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::iSWAP<std::complex<float>_>::iSWAP((iSWAP<std::complex<float>_> *)&mat2.data_,0,1);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1108,
             (SquareMatrix<std::complex<float>_> *)local_28);
  cVar5._M_value = (_ComplexT)local_1108;
  m10._M_value = 0;
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)&mat2.data_,Left,NoTrans,2,
             (SquareMatrix<std::complex<float>_> *)cVar5._M_value,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_1118,(SquareMatrix<std::complex<float>_> *)local_1108);
  qclab::qgates::iSWAP<std::complex<float>_>::matrix((iSWAP<std::complex<float>_> *)&mat.data_);
  cVar7._M_value = (_ComplexT)&mat.data_;
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<float>>>
            (&local_1118,(SquareMatrix<std::complex<float>_> *)cVar7._M_value);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&mat.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1118);
  std::complex<float>::complex(&local_1140,1.0,0.0);
  std::complex<float>::complex(&local_1148,2.0,0.0);
  std::complex<float>::complex(&local_1150,3.0,0.0);
  std::complex<float>::complex(&local_1158,4.0,0.0);
  std::complex<float>::complex(&local_1160,5.0,0.0);
  std::complex<float>::complex(&local_1168,6.0,0.0);
  std::complex<float>::complex(&local_1170,7.0,0.0);
  std::complex<float>::complex(&local_1178,8.0,0.0);
  std::complex<float>::complex(&local_1180,9.0,0.0);
  std::complex<float>::complex(&local_1188,10.0,0.0);
  std::complex<float>::complex(&local_1190,11.0,0.0);
  std::complex<float>::complex(&local_1198,12.0,0.0);
  std::complex<float>::complex(&local_11a0,13.0,0.0);
  std::complex<float>::complex(&local_11a8,14.0,0.0);
  std::complex<float>::complex(&local_11b0,15.0,0.0);
  std::complex<float>::complex(&local_11b8,16.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1138,cVar7,m01_00,local_1180,cVar5,m10,
             local_1180,local_1188,local_1190,local_1198,local_11a0,local_11a8,local_11b0,local_11b8
             ,in_stack_ffffffffffffea18,in_stack_ffffffffffffea20,in_stack_ffffffffffffea28);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=
            ((SquareMatrix<std::complex<float>_> *)local_1108,
             (SquareMatrix<std::complex<float>_> *)local_1138);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)&mat2.data_,Left,NoTrans,2,
             (SquareMatrix<std::complex<float>_> *)local_1108,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_11c8,(SquareMatrix<std::complex<float>_> *)local_1108);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_11e8,(SquareMatrix<std::complex<float>_> *)local_1138);
  qclab::qgates::iSWAP<std::complex<float>_>::matrix((iSWAP<std::complex<float>_> *)&local_11f8);
  qclab::dense::operator*((dense *)&local_11d8,&local_11e8,&local_11f8);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<float>>>
            (&local_11c8,&local_11d8);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_11d8);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_11f8);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_11e8);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_11c8);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=
            ((SquareMatrix<std::complex<float>_> *)local_1108,
             (SquareMatrix<std::complex<float>_> *)local_1138);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)&mat2.data_,Right,NoTrans,2,
             (SquareMatrix<std::complex<float>_> *)local_1108,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_1208,(SquareMatrix<std::complex<float>_> *)local_1108);
  qclab::qgates::iSWAP<std::complex<float>_>::matrix((iSWAP<std::complex<float>_> *)&iswapH.data_);
  qclab::dense::operator*
            ((dense *)&local_1218,(SquareMatrix<std::complex<float>_> *)&iswapH.data_,
             (SquareMatrix<std::complex<float>_> *)local_1138);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<float>>>
            (&local_1208,&local_1218);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1218);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&iswapH.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1208);
  qclab::qgates::iSWAP<std::complex<float>_>::matrix((iSWAP<std::complex<float>_> *)&local_1248);
  qclab::dense::conjTrans<qclab::dense::SquareMatrix<std::complex<float>>>
            ((dense *)local_1238,&local_1248);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1248);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=
            ((SquareMatrix<std::complex<float>_> *)local_1108,
             (SquareMatrix<std::complex<float>_> *)local_1138);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)&mat2.data_,Left,ConjTrans,2,
             (SquareMatrix<std::complex<float>_> *)local_1108,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_1258,(SquareMatrix<std::complex<float>_> *)local_1108);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_1278,(SquareMatrix<std::complex<float>_> *)local_1138);
  qclab::dense::operator*
            ((dense *)&local_1268,&local_1278,(SquareMatrix<std::complex<float>_> *)local_1238);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<float>>>
            (&local_1258,&local_1268);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1268);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1278);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1258);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=
            ((SquareMatrix<std::complex<float>_> *)local_1108,
             (SquareMatrix<std::complex<float>_> *)local_1138);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)&mat2.data_,Right,ConjTrans,2,
             (SquareMatrix<std::complex<float>_> *)local_1108,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_1288,(SquareMatrix<std::complex<float>_> *)local_1108);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&mat3.data_,
             (SquareMatrix<std::complex<float>_> *)local_1238);
  qclab::dense::operator*
            ((dense *)&local_1298,(SquareMatrix<std::complex<float>_> *)&mat3.data_,
             (SquareMatrix<std::complex<float>_> *)local_1138);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<float>>>
            (&local_1288,&local_1298);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1298);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&mat3.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1288);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_12b8,
             (SquareMatrix<std::complex<float>_> *)&I4.data_);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)&mat2.data_,Left,NoTrans,3,
             (SquareMatrix<std::complex<float>_> *)local_12b8,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_12c8,(SquareMatrix<std::complex<float>_> *)local_12b8);
  qclab::qgates::iSWAP<std::complex<float>_>::matrix((iSWAP<std::complex<float>_> *)&local_12e8);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_12d8,&local_12e8,(SquareMatrix<std::complex<float>_> *)&I2.data_);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<float>>>
            (&local_12c8,&local_12d8);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_12d8);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_12e8);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_12c8);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=
            ((SquareMatrix<std::complex<float>_> *)local_12b8,
             (SquareMatrix<std::complex<float>_> *)&I4.data_);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)&mat2.data_,Right,NoTrans,3,
             (SquareMatrix<std::complex<float>_> *)local_12b8,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_12f8,(SquareMatrix<std::complex<float>_> *)local_12b8);
  qclab::qgates::iSWAP<std::complex<float>_>::matrix((iSWAP<std::complex<float>_> *)&local_1318);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_1308,&local_1318,(SquareMatrix<std::complex<float>_> *)&I2.data_);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<float>>>
            (&local_12f8,&local_1308);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1308);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1318);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_12f8);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=
            ((SquareMatrix<std::complex<float>_> *)local_12b8,
             (SquareMatrix<std::complex<float>_> *)&I4.data_);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)&mat2.data_,Left,ConjTrans,3,
             (SquareMatrix<std::complex<float>_> *)local_12b8,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_1328,(SquareMatrix<std::complex<float>_> *)local_12b8);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_1338,(SquareMatrix<std::complex<float>_> *)local_1238,
             (SquareMatrix<std::complex<float>_> *)&I2.data_);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<float>>>
            (&local_1328,&local_1338);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1338);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1328);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=
            ((SquareMatrix<std::complex<float>_> *)local_12b8,
             (SquareMatrix<std::complex<float>_> *)&I4.data_);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)&mat2.data_,Right,ConjTrans,3,
             (SquareMatrix<std::complex<float>_> *)local_12b8,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_1348,(SquareMatrix<std::complex<float>_> *)local_12b8);
  qclab::dense::kron<std::complex<float>>
            ((dense *)qnew_2,(SquareMatrix<std::complex<float>_> *)local_1238,
             (SquareMatrix<std::complex<float>_> *)&I2.data_);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<float>>>
            (&local_1348,(SquareMatrix<std::complex<float>_> *)qnew_2);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)qnew_2);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1348);
  local_1360[0] = 1;
  local_1360[1] = 2;
  qclab::qgates::iSWAP<std::complex<float>_>::setQubits
            ((iSWAP<std::complex<float>_> *)&mat2.data_,local_1360);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=
            ((SquareMatrix<std::complex<float>_> *)local_12b8,
             (SquareMatrix<std::complex<float>_> *)&I4.data_);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)&mat2.data_,Left,NoTrans,3,
             (SquareMatrix<std::complex<float>_> *)local_12b8,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_1370,(SquareMatrix<std::complex<float>_> *)local_12b8);
  qclab::qgates::iSWAP<std::complex<float>_>::matrix((iSWAP<std::complex<float>_> *)&local_1390);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_1380,(SquareMatrix<std::complex<float>_> *)&I2.data_,&local_1390);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<float>>>
            (&local_1370,&local_1380);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1380);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1390);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1370);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=
            ((SquareMatrix<std::complex<float>_> *)local_12b8,
             (SquareMatrix<std::complex<float>_> *)&I4.data_);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)&mat2.data_,Right,NoTrans,3,
             (SquareMatrix<std::complex<float>_> *)local_12b8,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_13a0,(SquareMatrix<std::complex<float>_> *)local_12b8);
  qclab::qgates::iSWAP<std::complex<float>_>::matrix((iSWAP<std::complex<float>_> *)&local_13c0);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_13b0,(SquareMatrix<std::complex<float>_> *)&I2.data_,&local_13c0);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<float>>>
            (&local_13a0,&local_13b0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_13b0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_13c0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_13a0);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=
            ((SquareMatrix<std::complex<float>_> *)local_12b8,
             (SquareMatrix<std::complex<float>_> *)&I4.data_);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)&mat2.data_,Left,ConjTrans,3,
             (SquareMatrix<std::complex<float>_> *)local_12b8,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_13d0,(SquareMatrix<std::complex<float>_> *)local_12b8);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_13e0,(SquareMatrix<std::complex<float>_> *)&I2.data_,
             (SquareMatrix<std::complex<float>_> *)local_1238);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<float>>>
            (&local_13d0,&local_13e0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_13e0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_13d0);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=
            ((SquareMatrix<std::complex<float>_> *)local_12b8,
             (SquareMatrix<std::complex<float>_> *)&I4.data_);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)&mat2.data_,Right,ConjTrans,3,
             (SquareMatrix<std::complex<float>_> *)local_12b8,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_13f0,(SquareMatrix<std::complex<float>_> *)local_12b8);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&iswap_6.qubits_,(SquareMatrix<std::complex<float>_> *)&I2.data_,
             (SquareMatrix<std::complex<float>_> *)local_1238);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<float>>>
            (&local_13f0,(SquareMatrix<std::complex<float>_> *)&iswap_6.qubits_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&iswap_6.qubits_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_13f0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_12b8);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1238);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1138);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1108);
  qclab::qgates::iSWAP<std::complex<float>_>::~iSWAP((iSWAP<std::complex<float>_> *)&mat2.data_);
  qclab::qgates::iSWAP<std::complex<float>_>::iSWAP((iSWAP<std::complex<float>_> *)&i_1,0,2);
  std::complex<float>::complex((complex<float> *)&check.data_,0.0,1.0);
  qclab::dense::zeros<std::complex<float>>((dense *)&mat3_1.data_,8);
  pcVar6 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)&mat3_1.data_,0,0);
  std::complex<float>::operator=(pcVar6,1.0);
  pcVar6 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)&mat3_1.data_,4,1);
  pcVar6->_M_value =
       (_ComplexT)
       check.data_._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  pcVar6 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)&mat3_1.data_,2,2);
  std::complex<float>::operator=(pcVar6,1.0);
  pcVar6 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)&mat3_1.data_,6,3);
  pcVar6->_M_value =
       (_ComplexT)
       check.data_._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  pcVar6 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)&mat3_1.data_,1,4);
  pcVar6->_M_value =
       (_ComplexT)
       check.data_._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  pcVar6 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)&mat3_1.data_,5,5);
  std::complex<float>::operator=(pcVar6,1.0);
  pcVar6 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)&mat3_1.data_,3,6);
  pcVar6->_M_value =
       (_ComplexT)
       check.data_._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  pcVar6 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)&mat3_1.data_,7,7);
  std::complex<float>::operator=(pcVar6,1.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1438,
             (SquareMatrix<std::complex<float>_> *)&I4.data_);
  qclab::qgates::iSWAP<std::complex<float>_>::apply
            ((iSWAP<std::complex<float>_> *)&i_1,Left,NoTrans,3,
             (SquareMatrix<std::complex<float>_> *)local_1438,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_1448,(SquareMatrix<std::complex<float>_> *)local_1438);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_1458,(SquareMatrix<std::complex<float>_> *)&mat3_1.data_);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<float>>>
            (&local_1448,&local_1458);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1458);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1448);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1438);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&mat3_1.data_);
  qclab::qgates::iSWAP<std::complex<float>_>::~iSWAP((iSWAP<std::complex<float>_> *)&i_1);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_138);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c8);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_70);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)
             &v2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&I4.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_28);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&I2.data_);
  return;
}

Assistant:

void test_qclab_qgates_iSWAP() {

  const auto I1 = qclab::dense::eye< T >(  2 ) ;
  const auto I2 = qclab::dense::eye< T >(  4 ) ;
  const auto I3 = qclab::dense::eye< T >(  8 ) ;
  const auto I4 = qclab::dense::eye< T >( 16 ) ;

  using V = std::vector< T > ;
  const V v2 = { 3 , 5 , 2 , 7 } ;
  const V v3 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 } ;
  const V v4 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 , 7 , 2 , 5 , 6 , 8 , 9 , 5 , 1};

  {
    qclab::qgates::iSWAP< T >  iswap ;

    EXPECT_EQ( iswap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( iswap.fixed() ) ;        // fixed
    EXPECT_FALSE( iswap.controlled() ) ;  // controlled

    // qubit
    EXPECT_EQ( iswap.qubit() , 0 ) ;

    // qubits
    auto qubits = iswap.qubits() ;
    EXPECT_EQ( qubits.size() , 2 ) ;
    EXPECT_EQ( qubits[0] , 0 ) ;
    EXPECT_EQ( qubits[1] , 1 ) ;
    int qnew[] = { 3 , 5 } ;
    iswap.setQubits( &qnew[0] ) ;
    EXPECT_EQ( iswap.qubits()[0] , 3 ) ;
    EXPECT_EQ( iswap.qubits()[1] , 5 ) ;
    qnew[0] = 0 ;
    qnew[1] = 1 ;
    iswap.setQubits( &qnew[0] ) ;

    // matrix
    const T i(0,1) ;
    qclab::dense::SquareMatrix< T >  iSWAP_check( 1 , 0 , 0 , 0 ,
                                                  0 , 0 , i , 0 ,
                                                  0 , i , 0 , 0 ,
                                                  0 , 0 , 0 , 1 ) ;
    EXPECT_TRUE( iswap.matrix() == iSWAP_check ) ;

    // print
    iswap.print() ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( iswap.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "iswap q[0], q[1];\n" ) ;
    std::cout << qasm.str() ;

    // operators == and !=
    qclab::qgates::iSWAP< T >  iswap2( 2 , 4 ) ;
    EXPECT_TRUE(  iswap == iswap2 ) ;
    EXPECT_FALSE( iswap != iswap2 ) ;
  }

  {
    qclab::qgates::iSWAP< T >  iswap( 3 , 5 ) ;

    EXPECT_EQ( iswap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( iswap.fixed() ) ;        // fixed
    EXPECT_FALSE( iswap.controlled() ) ;  // controlled
    EXPECT_EQ( iswap.qubits()[0] , 3 ) ;  // qubit0
    EXPECT_EQ( iswap.qubits()[1] , 5 ) ;  // qubit1
  }

  {
    int qubits[] = { 3 , 5 } ;
    qclab::qgates::iSWAP< T >  iswap( &qubits[0] ) ;

    EXPECT_EQ( iswap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( iswap.fixed() ) ;        // fixed
    EXPECT_FALSE( iswap.controlled() ) ;  // controlled
    EXPECT_EQ( iswap.qubits()[0] , 3 ) ;  // qubit0
    EXPECT_EQ( iswap.qubits()[1] , 5 ) ;  // qubit1
  }

  {
    qclab::qgates::iSWAP< T >  iswap( 0 , 1 ) ;

    // apply (2 qubits)
    auto vec2 = v2 ;
    iswap.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    V check2 = { 3 , T(0,2) , T(0,5) , 7 } ;
    test_qclab_qgates_iSWAP_check( vec2 , check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { iswap.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    test_qclab_qgates_iSWAP_check( vec2 , check2 ) ;
  #endif
    vec2 = v2 ;
    iswap.apply( qclab::Op::ConjTrans , 2 , vec2 ) ;
    check2 = { 3 , T(0,-2) , T(0,-5) , 7 } ;
    test_qclab_qgates_iSWAP_check( vec2 , check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { iswap.apply_device( qclab::Op::ConjTrans , 2 , vec2_ ) ; }
    test_qclab_qgates_iSWAP_check( vec2 , check2 ) ;
  #endif

    // apply (3 qubits)
    auto vec3 = v3 ;
    iswap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 3 , 5 , T(0,4) , T(0,1) , T(0,2) , T(0,7) , 8 , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif
    vec3 = v3 ;
    iswap.apply( qclab::Op::ConjTrans , 3 , vec3 ) ;
    check3 = { 3 , 5 , T(0,-4) , T(0,-1) , T(0,-2) , T(0,-7) , 8 , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::ConjTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif

    int qnew[] = { 1 , 2 } ;
    iswap.setQubits( &qnew[0] ) ;
    vec3 = v3 ;
    iswap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    check3 = { 3 , T(0,2) , T(0,5) , 7 , 4 , T(0,8) , T(0,1) , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif
    vec3 = v3 ;
    iswap.apply( qclab::Op::ConjTrans , 3 , vec3 ) ;
    check3 = { 3 , T(0,-2) , T(0,-5) , 7 , 4 , T(0,-8) , T(0,-1) , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::ConjTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif

    // apply (4 qubits)
    auto vec4 = v4 ;
    iswap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    V check4 = { 3 , 5 , T(0,4) , T(0,1) , T(0,2) , T(0,7) , 8 , 3 ,
                 7 , 2 , T(0,8) , T(0,9) , T(0,5) , T(0,6) , 5 , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ; T* vec4_ = vec4.data() ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif
    vec4 = v4 ;
    iswap.apply( qclab::Op::ConjTrans , 4 , vec4 ) ;
    check4 = { 3 , 5 , T(0,-4) , T(0,-1) , T(0,-2) , T(0,-7) , 8 , 3 ,
               7 , 2 , T(0,-8) , T(0,-9) , T(0,-5) , T(0,-6) , 5 , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::ConjTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif

    qnew[0] = 0 ;
    qnew[1] = 1 ;
    iswap.setQubits( &qnew[0] ) ;
    vec4 = v4 ;
    iswap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    check4 = { 3 , 5 , 2 , 7 , T(0,7) , T(0,2) , T(0,5) , T(0,6) ,
               T(0,4) , T(0,1) , T(0,8) , T(0,3) , 8 , 9 , 5 , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif
    vec4 = v4 ;
    iswap.apply( qclab::Op::ConjTrans , 4 , vec4 ) ;
    check4 = { 3 , 5 , 2 , 7 , T(0,-7) , T(0,-2) , T(0,-5) , T(0,-6) ,
               T(0,-4) , T(0,-1) , T(0,-8) , T(0,-3) , 8 , 9 , 5 , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::ConjTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif

    qnew[0] = 2 ;
    qnew[1] = 3 ;
    iswap.setQubits( &qnew[0] ) ;
    vec4 = v4 ;
    iswap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    check4 = { 3 , T(0,2) , T(0,5) , 7 , 4 , T(0,8) , T(0,1) , 3 ,
               7 , T(0,5) , T(0,2) , 6 , 8 , T(0,5) , T(0,9) , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif
    vec4 = v4 ;
    iswap.apply( qclab::Op::ConjTrans , 4 , vec4 ) ;
    check4 = { 3 , T(0,-2) , T(0,-5) , 7 , 4 , T(0,-8) , T(0,-1) , 3 ,
               7 , T(0,-5) , T(0,-2) , 6 , 8 , T(0,-5) , T(0,-9) , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::ConjTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif
  }

  {
    qclab::qgates::iSWAP< T >  iswap( 0 , 2 ) ;

    // apply (3 qubits)
    auto vec3 = v3 ;
    iswap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 3 , T(0,4) , 2 , T(0,8) , T(0,5) , 1 , T(0,7) , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif
    vec3 = v3 ;
    iswap.apply( qclab::Op::ConjTrans , 3 , vec3 ) ;
    check3 = { 3 , T(0,-4) , 2 , T(0,-8) , T(0,-5) , 1 , T(0,-7) , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::ConjTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif
  }

  {
    qclab::qgates::iSWAP< T >  iswap( 0 , 1 ) ;

    // apply (2 qubits)
    auto mat2 = I2 ;
    iswap.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    test_qclab_qgates_iSWAP_check( mat2 , iswap.matrix() ) ;

    qclab::dense::SquareMatrix< T >  mat(  1 ,  2 ,  3 ,  4 ,
                                           5 ,  6 ,  7 ,  8 ,
                                           9 , 10 , 11 , 12 ,
                                          13 , 14 , 15 , 16 ) ;

    mat2 = mat ;
    iswap.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    test_qclab_qgates_iSWAP_check( mat2 , mat * iswap.matrix() ) ;

    mat2 = mat ;
    iswap.apply( qclab::Side::Right , qclab::Op::NoTrans , 2 , mat2 ) ;
    test_qclab_qgates_iSWAP_check( mat2 , iswap.matrix() * mat ) ;

    auto iswapH = qclab::dense::conjTrans( iswap.matrix() ) ;

    mat2 = mat ;
    iswap.apply( qclab::Side::Left , qclab::Op::ConjTrans , 2 , mat2 ) ;
    test_qclab_qgates_iSWAP_check( mat2 , mat * iswapH ) ;

    mat2 = mat ;
    iswap.apply( qclab::Side::Right , qclab::Op::ConjTrans , 2 , mat2 ) ;
    test_qclab_qgates_iSWAP_check( mat2 , iswapH * mat ) ;

    // apply (3 qubits)
    auto mat3 = I3 ;
    iswap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 ,
                                   qclab::dense::kron( iswap.matrix() , I1 ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Right , qclab::Op::NoTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 ,
                                   qclab::dense::kron( iswap.matrix() , I1 ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Left , qclab::Op::ConjTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 , qclab::dense::kron( iswapH , I1 ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Right , qclab::Op::ConjTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 , qclab::dense::kron( iswapH , I1 ) ) ;

    int qnew[] = { 1 , 2 } ;
    iswap.setQubits( &qnew[0] ) ;
    mat3 = I3 ;
    iswap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 ,
                                   qclab::dense::kron( I1 , iswap.matrix() ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Right , qclab::Op::NoTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 ,
                                   qclab::dense::kron( I1 , iswap.matrix() ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Left , qclab::Op::ConjTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 , qclab::dense::kron( I1 , iswapH ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Right , qclab::Op::ConjTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 , qclab::dense::kron( I1 , iswapH ) ) ;
  }

  {
    qclab::qgates::iSWAP< T >  iswap( 0 , 2 ) ;

    const T i(0,1) ;
    auto check = qclab::dense::zeros< T >( 8 ) ;
    check(0,0) = 1 ;
    check(4,1) = i ;
    check(2,2) = 1 ;
    check(6,3) = i ;
    check(1,4) = i ;
    check(5,5) = 1 ;
    check(3,6) = i ;
    check(7,7) = 1 ;

    // apply (3 qubits)
    auto mat3 = I3 ;
    iswap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 , check ) ;
  }

}